

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall testing::Matcher<void_*>::Matcher(Matcher<void_*> *this,void *value)

{
  MatcherBase<void_*> local_30;
  void *local_18;
  
  (this->super_MatcherBase<void_*>).impl_.value_ = (MatcherInterface<void_*> *)0x0;
  (this->super_MatcherBase<void_*>).impl_.link_.next_ =
       &(this->super_MatcherBase<void_*>).impl_.link_;
  (this->super_MatcherBase<void_*>)._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00167998;
  local_18 = value;
  internal::EqMatcher::operator_cast_to_Matcher((Matcher<void_*> *)&local_30,(EqMatcher *)&local_18)
  ;
  internal::linked_ptr<const_testing::MatcherInterface<void_*>_>::operator=
            (&(this->super_MatcherBase<void_*>).impl_,&local_30.impl_);
  internal::MatcherBase<void_*>::~MatcherBase(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }